

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_platform.cpp
# Opt level: O0

int vsprintf_s(char *buffer,size_t sizeOfBuffer,char *format,__va_list_tag *args)

{
  int iVar1;
  int local_38;
  int c;
  __va_list_tag *args_local;
  char *format_local;
  size_t sizeOfBuffer_local;
  char *buffer_local;
  
  if (sizeOfBuffer == 0) {
    buffer_local._4_4_ = 0;
  }
  else {
    local_38 = vsnprintf(buffer,sizeOfBuffer,format,args);
    buffer[sizeOfBuffer - 1] = '\0';
    iVar1 = (int)sizeOfBuffer;
    if (local_38 < 0) {
      buffer_local._4_4_ = iVar1 + -1;
    }
    else {
      if (iVar1 + -1 <= local_38) {
        local_38 = iVar1 + -1;
      }
      buffer_local._4_4_ = local_38;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int vsprintf_s(char* buffer, size_t sizeOfBuffer, const char* format, va_list args)
{
    if (!sizeOfBuffer)
    {
        return 0;
    }

    int c = vsnprintf(buffer, sizeOfBuffer, format, args);

    buffer[sizeOfBuffer - 1] = '\0';

    if (c < 0)
    {
        return sizeOfBuffer - 1;
    }

    return CRNLIB_MIN(c, (int)sizeOfBuffer - 1);
}